

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
assert_key_prefix_splits
          (tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,uint64_t splits)

{
  char *message;
  uint64_t local_30;
  uint64_t splits_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  AssertHelper local_18;
  __atomic_base<unsigned_long> local_10;
  
  local_10._M_i = (this->test_db).key_prefix_splits.super___atomic_base<unsigned_long>._M_i;
  local_30 = splits;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&splits_local,"(test_db.get_key_prefix_splits())","(splits)",&local_10._M_i
             ,&local_30);
  if ((char)splits_local == '\0') {
    testing::Message::Message((Message *)&local_10);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2d5,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_10);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)local_10._M_i != (long *)0x0) {
      (**(code **)(*(long *)local_10._M_i + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

constexpr void assert_key_prefix_splits(std::uint64_t splits) const noexcept {
    UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(), splits);
  }